

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_net_info.cc
# Opt level: O3

int __thiscall
aliyun::Rds::DescribeDBInstanceNetInfo
          (Rds *this,RdsDescribeDBInstanceNetInfoRequestType *req,
          RdsDescribeDBInstanceNetInfoResponseType *response,RdsErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  Value *pVVar10;
  Value *this_01;
  size_type *psVar11;
  uint uVar12;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value local_5d0;
  undefined1 local_5b8 [32];
  _Alloc_hider local_598;
  size_type local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  RdsDescribeDBInstanceNetInfoResponseType *local_578;
  uint local_56c;
  string local_568;
  long *local_548;
  long local_540;
  long local_538 [2];
  string local_528;
  undefined1 local_508 [24];
  string local_4f0 [8];
  size_type local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  _Alloc_hider local_4d0;
  size_type local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  _Alloc_hider local_4b0;
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  _Alloc_hider local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  _Alloc_hider local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  Value *local_428;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_528._M_string_length = 0;
  local_528.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_548 = local_538;
  local_578 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_548,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_508);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_5b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_568);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_548,local_540 + (long)local_548);
  std::__cxx11::string::append((char *)&local_140);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_420.field_2._M_allocated_capacity = *psVar11;
    local_420.field_2._8_8_ = plVar7[3];
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  }
  else {
    local_420.field_2._M_allocated_capacity = *psVar11;
    local_420._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_420._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_5d0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"DescribeDBInstanceNetInfo","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar2 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar2 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar2 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->client_token)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"ClientToken","");
    pcVar2 = (req->client_token)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->client_token)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->db_instance_id)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"DBInstanceId","");
    pcVar2 = (req->db_instance_id)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + (req->db_instance_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->flag)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Flag","");
    pcVar2 = (req->flag)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar2,pcVar2 + (req->flag)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"OwnerAccount","");
    pcVar2 = (req->owner_account)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar2,pcVar2 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_508);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_528);
    if (((0 < iVar4) && (local_528._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_528,&local_5d0,true), bVar3)) {
      if (error_info != (RdsErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_5d0,"RequestId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_5d0,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_508,pVVar9);
        }
        else {
          local_508._0_8_ = local_508 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_508,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_508);
        pcVar2 = local_508 + 0x10;
        if ((pointer)local_508._0_8_ != pcVar2) {
          operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_5d0,"Code");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_5d0,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_508,pVVar9);
        }
        else {
          local_508._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_508,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_508);
        if ((pointer)local_508._0_8_ != pcVar2) {
          operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_5d0,"HostId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_5d0,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_508,pVVar9);
        }
        else {
          local_508._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_508,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_508);
        if ((pointer)local_508._0_8_ != pcVar2) {
          operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_5d0,"Message");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_5d0,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_508,pVVar9);
        }
        else {
          local_508._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_508,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_508);
        if ((pointer)local_508._0_8_ != pcVar2) {
          operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
        }
      }
      if (local_578 != (RdsDescribeDBInstanceNetInfoResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_5d0,"InstanceNetworkType");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_5d0,"InstanceNetworkType");
          Json::Value::asString_abi_cxx11_((string *)local_508,pVVar9);
          std::__cxx11::string::operator=
                    ((string *)&local_578->instance_network_type,(string *)local_508);
          if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
            operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_5d0,"DBInstanceNetInfos");
        iVar4 = 200;
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_5d0,"DBInstanceNetInfos");
          bVar3 = Json::Value::isMember(pVVar9,"DBInstanceNetInfo");
          if (bVar3) {
            pVVar9 = Json::Value::operator[](&local_5d0,"DBInstanceNetInfos");
            pVVar9 = Json::Value::operator[](pVVar9,"DBInstanceNetInfo");
            bVar3 = Json::Value::isArray(pVVar9);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              pcVar2 = local_5b8 + 0x10;
              uVar12 = 0;
              local_428 = pVVar9;
              do {
                local_508._0_8_ = (pointer)0x0;
                local_508._8_8_ = (pointer)0x0;
                local_508._16_8_ = 0;
                local_4f0 = (string  [8])&local_4e0;
                local_4e8 = 0;
                local_4e0._M_local_buf[0] = '\0';
                local_4d0._M_p = (pointer)&local_4c0;
                local_4c8 = 0;
                local_4c0._M_local_buf[0] = '\0';
                local_4b0._M_p = (pointer)&local_4a0;
                local_4a8 = 0;
                local_4a0._M_local_buf[0] = '\0';
                local_490._M_p = (pointer)&local_480;
                local_488 = 0;
                local_480._M_local_buf[0] = '\0';
                local_470._M_p = (pointer)&local_460;
                local_468 = 0;
                local_460._M_local_buf[0] = '\0';
                local_450._M_p = (pointer)&local_440;
                local_448 = 0;
                local_440._M_local_buf[0] = '\0';
                local_56c = uVar12;
                pVVar9 = Json::Value::operator[](pVVar9,uVar12);
                bVar3 = Json::Value::isMember(pVVar9,"ConnectionString");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"ConnectionString");
                  Json::Value::asString_abi_cxx11_((string *)local_5b8,pVVar10);
                  std::__cxx11::string::operator=(local_4f0,(string *)local_5b8);
                  if ((pointer)local_5b8._0_8_ != pcVar2) {
                    operator_delete((void *)local_5b8._0_8_,
                                    CONCAT71(local_5b8._17_7_,local_5b8[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"IPAddress");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"IPAddress");
                  Json::Value::asString_abi_cxx11_((string *)local_5b8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_4d0,(string *)local_5b8);
                  if ((pointer)local_5b8._0_8_ != pcVar2) {
                    operator_delete((void *)local_5b8._0_8_,
                                    CONCAT71(local_5b8._17_7_,local_5b8[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"IPType");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"IPType");
                  Json::Value::asString_abi_cxx11_((string *)local_5b8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_5b8);
                  if ((pointer)local_5b8._0_8_ != pcVar2) {
                    operator_delete((void *)local_5b8._0_8_,
                                    CONCAT71(local_5b8._17_7_,local_5b8[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"Port");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Port");
                  Json::Value::asString_abi_cxx11_((string *)local_5b8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_490,(string *)local_5b8);
                  if ((pointer)local_5b8._0_8_ != pcVar2) {
                    operator_delete((void *)local_5b8._0_8_,
                                    CONCAT71(local_5b8._17_7_,local_5b8[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"VPCId");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"VPCId");
                  Json::Value::asString_abi_cxx11_((string *)local_5b8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_470,(string *)local_5b8);
                  if ((pointer)local_5b8._0_8_ != pcVar2) {
                    operator_delete((void *)local_5b8._0_8_,
                                    CONCAT71(local_5b8._17_7_,local_5b8[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"VSwitchId");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"VSwitchId");
                  Json::Value::asString_abi_cxx11_((string *)local_5b8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_450,(string *)local_5b8);
                  if ((pointer)local_5b8._0_8_ != pcVar2) {
                    operator_delete((void *)local_5b8._0_8_,
                                    CONCAT71(local_5b8._17_7_,local_5b8[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"SecurityIPGroups");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"SecurityIPGroups");
                  bVar3 = Json::Value::isMember(pVVar10,"securityIPGroups");
                  if (bVar3) {
                    pVVar9 = Json::Value::operator[](pVVar9,"SecurityIPGroups");
                    pVVar9 = Json::Value::operator[](pVVar9,"securityIPGroups");
                    bVar3 = Json::Value::isArray(pVVar9);
                    if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
                      uVar12 = 0;
                      do {
                        local_5b8._8_8_ = 0;
                        local_5b8[0x10] = '\0';
                        local_598._M_p = (pointer)&local_588;
                        local_590 = 0;
                        local_588._M_local_buf[0] = '\0';
                        local_5b8._0_8_ = pcVar2;
                        pVVar10 = Json::Value::operator[](pVVar9,uVar12);
                        bVar3 = Json::Value::isMember(pVVar10,"SecurityIPGroupName");
                        if (bVar3) {
                          this_01 = Json::Value::operator[](pVVar10,"SecurityIPGroupName");
                          Json::Value::asString_abi_cxx11_(&local_568,this_01);
                          std::__cxx11::string::operator=((string *)local_5b8,(string *)&local_568);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_568._M_dataplus._M_p != &local_568.field_2) {
                            operator_delete(local_568._M_dataplus._M_p,
                                            local_568.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar10,"SecurityIPs");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar10,"SecurityIPs");
                          Json::Value::asString_abi_cxx11_(&local_568,pVVar10);
                          std::__cxx11::string::operator=((string *)&local_598,(string *)&local_568)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_568._M_dataplus._M_p != &local_568.field_2) {
                            operator_delete(local_568._M_dataplus._M_p,
                                            local_568.field_2._M_allocated_capacity + 1);
                          }
                        }
                        std::
                        vector<aliyun::RdsDescribeDBInstanceNetInfosecurityIPGroupsType,_std::allocator<aliyun::RdsDescribeDBInstanceNetInfosecurityIPGroupsType>_>
                        ::push_back((vector<aliyun::RdsDescribeDBInstanceNetInfosecurityIPGroupsType,_std::allocator<aliyun::RdsDescribeDBInstanceNetInfosecurityIPGroupsType>_>
                                     *)local_508,(value_type *)local_5b8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_598._M_p != &local_588) {
                          operator_delete(local_598._M_p,
                                          CONCAT71(local_588._M_allocated_capacity._1_7_,
                                                   local_588._M_local_buf[0]) + 1);
                        }
                        if ((pointer)local_5b8._0_8_ != pcVar2) {
                          operator_delete((void *)local_5b8._0_8_,
                                          CONCAT71(local_5b8._17_7_,local_5b8[0x10]) + 1);
                        }
                        AVar5 = Json::Value::size(pVVar9);
                        uVar12 = uVar12 + 1;
                      } while (uVar12 < AVar5);
                    }
                  }
                }
                std::
                vector<aliyun::RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType,_std::allocator<aliyun::RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType>_>
                ::push_back(&local_578->db_instance_net_infos,(value_type *)local_508);
                RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType::
                ~RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType
                          ((RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType *)local_508);
                pVVar9 = local_428;
                AVar5 = Json::Value::size(local_428);
                uVar12 = local_56c + 1;
              } while (uVar12 < AVar5);
            }
          }
        }
      }
      goto LAB_0016e1c5;
    }
    if (error_info == (RdsErrorInfo *)0x0) goto LAB_0016e1c0;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (RdsErrorInfo *)0x0) {
LAB_0016e1c0:
      iVar4 = -1;
      goto LAB_0016e1c5;
    }
    pcVar6 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_0016e1c5:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_5d0);
  if (local_548 != local_538) {
    operator_delete(local_548,local_538[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,
                    CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                             local_528.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Rds::DescribeDBInstanceNetInfo(const RdsDescribeDBInstanceNetInfoRequestType& req,
                      RdsDescribeDBInstanceNetInfoResponseType* response,
                       RdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDBInstanceNetInfo");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.client_token.empty()) {
    req_rpc->AddRequestQuery("ClientToken", req.client_token);
  }
  if(!req.db_instance_id.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId", req.db_instance_id);
  }
  if(!req.flag.empty()) {
    req_rpc->AddRequestQuery("Flag", req.flag);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}